

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O1

void __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_320UL,_16UL>_>
::delete_arrays(table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_320UL,_16UL>_>
                *this,arrays_type *arrays_)

{
  short *psVar1;
  byte bVar2;
  mi_segment_t *segment;
  long lVar3;
  ulong uVar4;
  mi_segment_t *pmVar5;
  mi_page_t *page;
  mi_threadid_t *in_FS_OFFSET;
  
  segment = (mi_segment_t *)arrays_->elements_;
  if (segment != (mi_segment_t *)0x0) {
    pmVar5 = (mi_segment_t *)
             (this->
             super_empty_value<slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_320UL,_16UL>,_2U,_false>
             ).value_.storage;
    if (&pmVar5->slices[0].used < segment || segment < pmVar5) {
      pmVar5 = (mi_segment_t *)
               ((ulong)((long)segment[-1].slices[0x200].padding + 7) & 0xfffffffffe000000);
      if (0 < (long)pmVar5) {
        uVar4 = (ulong)((long)segment - (long)pmVar5) >> 0x10;
        lVar3 = uVar4 * 0x60 - (ulong)pmVar5->slices[uVar4].slice_offset;
        page = (mi_page_t *)((long)pmVar5 + lVar3 + 0x120);
        if (pmVar5->thread_id != *in_FS_OFFSET) {
          uVar4 = (long)segment - *(long *)((long)pmVar5 + lVar3 + 0x150);
          bVar2 = *(byte *)((long)pmVar5 + lVar3 + 0x142);
          if (bVar2 == 0) {
            uVar4 = uVar4 % *(ulong *)((long)pmVar5 + lVar3 + 0x148);
          }
          else {
            uVar4 = uVar4 & ~(-1L << (bVar2 & 0x3f));
          }
          mi_free_block_mt(page,pmVar5,(mi_block_t *)((long)segment - uVar4));
          return;
        }
        if (*(char *)((long)pmVar5 + lVar3 + 0x12e) != '\0') {
          mi_free_generic_local(page,segment,segment);
          return;
        }
        (segment->memid).mem.os.base = *(void **)((long)pmVar5 + lVar3 + 0x138);
        *(mi_segment_t **)((long)pmVar5 + lVar3 + 0x138) = segment;
        psVar1 = (short *)((long)pmVar5 + lVar3 + 0x140);
        *psVar1 = *psVar1 + -1;
        if (*psVar1 == 0) {
          _mi_page_retire(page);
          return;
        }
      }
      return;
    }
    lVar3._0_2_ = pmVar5->slices[0].used;
    lVar3._2_1_ = pmVar5->slices[0].block_size_shift;
    lVar3._3_1_ = pmVar5->slices[0].heap_tag;
    lVar3._4_4_ = *(undefined4 *)&pmVar5->slices[0].field_0x24;
    if ((long)&(segment->memid).mem +
        (((arrays_->groups_size_mask * 0x268 + 0x276) / 0x28) * 0x28 + 0xf & 0xfffffffffffffff0) ==
        lVar3) {
      *(mi_segment_t **)&pmVar5->slices[0].used = segment;
      return;
    }
  }
  return;
}

Assistant:

void delete_arrays(arrays_type& arrays_) noexcept {
        arrays_type::delete_(typename arrays_type::allocator_type(al()), arrays_);
    }